

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

void __thiscall
kj::anon_unknown_36::WrappableStreamMixin<kj::(anonymous_namespace)::HttpOutputStream>::
unsetCurrentWrapper(WrappableStreamMixin<kj::(anonymous_namespace)::HttpOutputStream> *this,
                   Maybe<kj::(anonymous_namespace)::HttpOutputStream_&> *weakRef)

{
  Maybe<kj::(anonymous_namespace)::HttpOutputStream_&> **in_RDX;
  Maybe<kj::(anonymous_namespace)::HttpOutputStream_&> **value;
  char (*params) [63];
  long lVar1;
  CappedArray<char,_17UL> *in_R8;
  Fault f;
  DebugComparison<kj::Maybe<kj::(anonymous_namespace)::HttpOutputStream_&>_*,_kj::Maybe<kj::(anonymous_namespace)::HttpOutputStream_&>_*>
  _kjCondition;
  String argValues [2];
  CappedArray<char,_17UL> local_78;
  Array<char> local_58;
  CappedArray<char,_17UL> local_40;
  
  _kjCondition.left = (this->currentWrapper).ptr;
  if (_kjCondition.left == (Maybe<kj::(anonymous_namespace)::HttpOutputStream_&> *)0x0) {
    kj::_::Debug::Fault::Fault
              ((Fault *)argValues,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,0x52c,FAILED,"currentWrapper != nullptr","");
    kj::_::Debug::Fault::fatal((Fault *)argValues);
  }
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = _kjCondition.left == weakRef;
  if (_kjCondition.result) {
    weakRef->ptr = (HttpOutputStream *)0x0;
    (this->currentWrapper).ptr = (Maybe<kj::(anonymous_namespace)::HttpOutputStream_&> *)0x0;
    return;
  }
  f.exception = (Exception *)0x0;
  _kjCondition.right = weakRef;
  kj::_::
  tryToCharSequence<kj::Maybe<kj::(anonymous_namespace)::HttpOutputStream&>*,kj::CappedArray<char,17ul>>
            (&local_78,(_ *)&_kjCondition,in_RDX);
  kj::_::
  tryToCharSequence<kj::Maybe<kj::(anonymous_namespace)::HttpOutputStream&>*,kj::CappedArray<char,17ul>>
            (&local_40,(_ *)&_kjCondition.right,value);
  kj::_::concat<kj::CappedArray<char,17ul>,kj::StringPtr&,kj::CappedArray<char,17ul>>
            ((String *)&local_58,(_ *)&local_78,(CappedArray<char,_17UL> *)&_kjCondition.op,
             (StringPtr *)&local_40,in_R8);
  argValues[0].content.ptr = local_58.ptr;
  argValues[0].content.size_ = local_58.size_;
  argValues[0].content.disposer = local_58.disposer;
  local_58.ptr = (char *)0x0;
  local_58.size_ = 0;
  Array<char>::~Array(&local_58);
  str<char_const(&)[63]>
            (argValues + 1,(kj *)"bug in KJ HTTP: unsetCurrentWrapper() passed the wrong wrapper",
             params);
  local_78.currentSize = (size_t)argValues;
  local_78.content[0] = '\x02';
  local_78.content[1] = '\0';
  local_78.content[2] = '\0';
  local_78.content[3] = '\0';
  local_78.content[4] = '\0';
  local_78.content[5] = '\0';
  local_78.content[6] = '\0';
  local_78.content[7] = '\0';
  kj::_::Debug::Fault::init
            (&f,(EVP_PKEY_CTX *)
                "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
            );
  lVar1 = 0x18;
  do {
    Array<char>::~Array((Array<char> *)((long)&argValues[0].content.ptr + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

~WrappableStreamMixin() noexcept(false) {
    KJ_IF_SOME(w, currentWrapper) {
      KJ_LOG(ERROR, "HTTP connection destroyed while HTTP body streams still exist",
          kj::getStackTrace());
      w = kj::none;
    }
  }